

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void sf_glad_gl_load_GL_VERSION_3_2(GLADuserptrloadfunc load,void *userptr)

{
  undefined8 in_RSI;
  code *in_RDI;
  
  if (SF_GLAD_GL_VERSION_3_2 != 0) {
    sf_glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*in_RDI)(in_RSI,"glClientWaitSync");
    sf_glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*in_RDI)(in_RSI,"glDeleteSync");
    sf_glad_glDrawElementsBaseVertex =
         (PFNGLDRAWELEMENTSBASEVERTEXPROC)(*in_RDI)(in_RSI,"glDrawElementsBaseVertex");
    sf_glad_glDrawElementsInstancedBaseVertex =
         (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)
         (*in_RDI)(in_RSI,"glDrawElementsInstancedBaseVertex");
    sf_glad_glDrawRangeElementsBaseVertex =
         (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)(*in_RDI)(in_RSI,"glDrawRangeElementsBaseVertex");
    sf_glad_glFenceSync = (PFNGLFENCESYNCPROC)(*in_RDI)(in_RSI,"glFenceSync");
    sf_glad_glFramebufferTexture =
         (PFNGLFRAMEBUFFERTEXTUREPROC)(*in_RDI)(in_RSI,"glFramebufferTexture");
    sf_glad_glGetBufferParameteri64v =
         (PFNGLGETBUFFERPARAMETERI64VPROC)(*in_RDI)(in_RSI,"glGetBufferParameteri64v");
    sf_glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*in_RDI)(in_RSI,"glGetInteger64i_v");
    sf_glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*in_RDI)(in_RSI,"glGetInteger64v");
    sf_glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*in_RDI)(in_RSI,"glGetMultisamplefv");
    sf_glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*in_RDI)(in_RSI,"glGetSynciv");
    sf_glad_glIsSync = (PFNGLISSYNCPROC)(*in_RDI)(in_RSI,"glIsSync");
    sf_glad_glMultiDrawElementsBaseVertex =
         (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)(*in_RDI)(in_RSI,"glMultiDrawElementsBaseVertex");
    sf_glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)(*in_RDI)(in_RSI,"glProvokingVertex");
    sf_glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*in_RDI)(in_RSI,"glSampleMaski");
    sf_glad_glTexImage2DMultisample =
         (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*in_RDI)(in_RSI,"glTexImage2DMultisample");
    sf_glad_glTexImage3DMultisample =
         (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*in_RDI)(in_RSI,"glTexImage3DMultisample");
    sf_glad_glWaitSync = (PFNGLWAITSYNCPROC)(*in_RDI)(in_RSI,"glWaitSync");
  }
  return;
}

Assistant:

static void sf_glad_gl_load_GL_VERSION_3_2( GLADuserptrloadfunc load, void* userptr) {
    if(!SF_GLAD_GL_VERSION_3_2) return;
    sf_glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC) load(userptr, "glClientWaitSync");
    sf_glad_glDeleteSync = (PFNGLDELETESYNCPROC) load(userptr, "glDeleteSync");
    sf_glad_glDrawElementsBaseVertex = (PFNGLDRAWELEMENTSBASEVERTEXPROC) load(userptr, "glDrawElementsBaseVertex");
    sf_glad_glDrawElementsInstancedBaseVertex = (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC) load(userptr, "glDrawElementsInstancedBaseVertex");
    sf_glad_glDrawRangeElementsBaseVertex = (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC) load(userptr, "glDrawRangeElementsBaseVertex");
    sf_glad_glFenceSync = (PFNGLFENCESYNCPROC) load(userptr, "glFenceSync");
    sf_glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC) load(userptr, "glFramebufferTexture");
    sf_glad_glGetBufferParameteri64v = (PFNGLGETBUFFERPARAMETERI64VPROC) load(userptr, "glGetBufferParameteri64v");
    sf_glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC) load(userptr, "glGetInteger64i_v");
    sf_glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC) load(userptr, "glGetInteger64v");
    sf_glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC) load(userptr, "glGetMultisamplefv");
    sf_glad_glGetSynciv = (PFNGLGETSYNCIVPROC) load(userptr, "glGetSynciv");
    sf_glad_glIsSync = (PFNGLISSYNCPROC) load(userptr, "glIsSync");
    sf_glad_glMultiDrawElementsBaseVertex = (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC) load(userptr, "glMultiDrawElementsBaseVertex");
    sf_glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC) load(userptr, "glProvokingVertex");
    sf_glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC) load(userptr, "glSampleMaski");
    sf_glad_glTexImage2DMultisample = (PFNGLTEXIMAGE2DMULTISAMPLEPROC) load(userptr, "glTexImage2DMultisample");
    sf_glad_glTexImage3DMultisample = (PFNGLTEXIMAGE3DMULTISAMPLEPROC) load(userptr, "glTexImage3DMultisample");
    sf_glad_glWaitSync = (PFNGLWAITSYNCPROC) load(userptr, "glWaitSync");
}